

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O2

void __thiscall
cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
iterator::operator++(iterator *this)

{
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pcVar1;
  pointer puVar2;
  ulong uVar3;
  uint __line;
  ulong uVar4;
  char *__assertion;
  
  pcVar1 = this->Tree;
  if (pcVar1 == (cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    __assertion = "this->Tree";
    __line = 0x39;
  }
  else {
    puVar2 = (pcVar1->UpPositions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = (long)(pcVar1->UpPositions).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar2 >> 3;
    if (uVar4 == (long)(pcVar1->Data).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pcVar1->Data).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5) {
      uVar3 = this->Position;
      if (uVar4 < uVar3) {
        __assertion = "this->Position <= this->Tree->Data.size()";
        __line = 0x3b;
      }
      else {
        if (uVar3 != 0) {
          this->Position = puVar2[uVar3 - 1];
          return;
        }
        __assertion = "this->Position > 0";
        __line = 0x3c;
      }
    }
    else {
      __assertion = "this->Tree->UpPositions.size() == this->Tree->Data.size()";
      __line = 0x3a;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmLinkedTree.h"
                ,__line,
                "void cmLinkedTree<std::basic_string<char>>::iterator::operator++() [T = std::basic_string<char>]"
               );
}

Assistant:

void operator++()
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      this->Position = this->Tree->UpPositions[this->Position - 1];
    }